

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O2

void __thiscall
cmWorkerPoolInternal::cmWorkerPoolInternal(cmWorkerPoolInternal *this,cmWorkerPool *pool)

{
  _Head_base<0UL,_uv_loop_s_*,_false> __p;
  pointer in_RAX;
  _Head_base<0UL,_uv_loop_s_*,_false> local_28;
  
  this->WorkersRunning = 0;
  this->WorkersIdle = 0;
  this->JobsProcessing = 0;
  (this->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>._M_t.
  super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
  super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl = (uv_loop_s *)0x0;
  (this->UVRequestBegin).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.
  handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->UVRequestBegin).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.
  handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->UVRequestEnd).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle
  .super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->UVRequestEnd).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle
  .super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined4 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 0x27) = 0;
  local_28._M_head_impl = in_RAX;
  std::
  _Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
  ::_Deque_base(&(this->Queue).
                 super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
               );
  std::condition_variable::condition_variable(&this->Condition);
  (this->Workers).
  super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Workers).
  super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Workers).
  super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Pool = pool;
  uv_disable_stdio_inheritance();
  std::make_unique<uv_loop_s>();
  __p._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (uv_loop_s *)0x0;
  std::__uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>::reset
            ((__uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_> *)this,__p._M_head_impl);
  std::unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_>::~unique_ptr
            ((unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_> *)&local_28);
  uv_loop_init((this->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>
               ._M_t.super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
               super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl);
  return;
}

Assistant:

cmWorkerPoolInternal::cmWorkerPoolInternal(cmWorkerPool* pool)
  : Pool(pool)
{
  // Initialize libuv loop
  uv_disable_stdio_inheritance();
#ifdef CMAKE_UV_SIGNAL_HACK
  UVHackRAII = cm::make_unique<cmUVSignalHackRAII>();
#endif
  UVLoop = cm::make_unique<uv_loop_t>();
  uv_loop_init(UVLoop.get());
}